

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation.cpp
# Opt level: O2

void __thiscall
QDefaultAnimationDriver::QDefaultAnimationDriver(QDefaultAnimationDriver *this,QUnifiedTimer *timer)

{
  long in_FS_OFFSET;
  Object local_38;
  undefined8 local_28;
  Object local_20;
  
  local_20.super_QObject.d_ptr.d = *(QObjectData **)(in_FS_OFFSET + 0x28);
  QAnimationDriver::QAnimationDriver((QAnimationDriver *)this,(QObject *)0x0);
  *(undefined ***)this = &PTR_metaObject_00667a70;
  *(undefined4 *)(this + 0x10) = 0;
  *(QUnifiedTimer **)(this + 0x18) = timer;
  local_38.super_QObject.d_ptr.d = (QObjectData *)startTimer;
  local_28 = 0;
  QObject::connect<void(QAnimationDriver::*)(),void(QDefaultAnimationDriver::*)()>
            (&local_20,(offset_in_QAnimationDriver_to_subr)this,
             (ContextType *)QAnimationDriver::started,
             (offset_in_QDefaultAnimationDriver_to_subr *)0x0,(ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)&local_20);
  local_38.super_QObject.d_ptr.d = (QObjectData *)stopTimer;
  local_28 = 0;
  QObject::connect<void(QAnimationDriver::*)(),void(QDefaultAnimationDriver::*)()>
            (&local_38,(offset_in_QAnimationDriver_to_subr)this,
             (ContextType *)QAnimationDriver::stopped,
             (offset_in_QDefaultAnimationDriver_to_subr *)0x0,(ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)&local_38);
  if (*(QObjectData **)(in_FS_OFFSET + 0x28) == local_20.super_QObject.d_ptr.d) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QDefaultAnimationDriver::QDefaultAnimationDriver(QUnifiedTimer *timer)
    : QAnimationDriver(nullptr), m_unified_timer(timer)
{
    connect(this, &QAnimationDriver::started, this, &QDefaultAnimationDriver::startTimer);
    connect(this, &QAnimationDriver::stopped, this, &QDefaultAnimationDriver::stopTimer);
}